

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall
HighsSimplexAnalysis::setup
          (HighsSimplexAnalysis *this,string *lp_name,HighsLp *lp,HighsOptions *options,
          HighsInt simplex_iteration_count_)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  AnIterOpRec *pAVar7;
  HighsSimplexAnalysis *pHVar8;
  HighsSimplexAnalysis *pHVar9;
  HighsInt *pHVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  HighsValueDistribution *value_distribution;
  bool bVar14;
  uint uVar16;
  double dVar15;
  uint uVar17;
  allocator local_47a;
  allocator local_479;
  HighsSimplexAnalysis *local_478;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = lp->num_row_;
  this->numRow = iVar3;
  iVar4 = lp->num_col_;
  this->numCol = iVar4;
  this->numTot = iVar4 + iVar3;
  std::__cxx11::string::_M_assign((string *)&this->model_name_);
  std::__cxx11::string::_M_assign((string *)&this->lp_name_);
  bVar2 = (byte)(options->super_HighsOptionsStruct).highs_analysis_level;
  this->analyse_lp_data = (bool)(bVar2 & 1);
  bVar11 = (bool)(bVar2 >> 1 & 1);
  this->analyse_simplex_summary_data = bVar11;
  bVar12 = (bool)(bVar2 >> 2 & 1);
  this->analyse_simplex_runtime_data = bVar12;
  this->analyse_factor_data = (bool)(bVar2 >> 4 & 1);
  bVar14 = true;
  if (bVar11 == false) {
    bVar14 = bVar12;
  }
  this->analyse_simplex_data = bVar14;
  this->highs_run_time = 0.0;
  this->last_user_log_time = -INFINITY;
  this->delta_user_log_time = 5.0;
  setupSimplexTime(this,options);
  setupFactorTime(this,options);
  this->AnIterIt0 = simplex_iteration_count_;
  HighsLogOptions::operator=(&this->log_options,&(options->super_HighsOptionsStruct).log_options);
  this->timeless_log = (options->super_HighsOptionsStruct).timeless_log;
  this->row_basic_feasibility_change_density = 0.0;
  this->col_BFRT_density = 0.0;
  this->col_steepest_edge_density = 0.0;
  this->col_basic_feasibility_change_density = 0.0;
  this->row_ap_density = 0.0;
  this->row_DSE_density = 0.0;
  this->primal_col_density = 0.0;
  this->col_aq_density = 0.0;
  this->row_ep_density = 0.0;
  this->dual_col_density = 1.0;
  std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::resize(&this->tran_stage,6);
  std::__cxx11::string::assign
            ((char *)(this->tran_stage).
                     super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::assign
            ((char *)((this->tran_stage).
                      super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1));
  std::__cxx11::string::assign
            ((char *)((this->tran_stage).
                      super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                      _M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::assign
            ((char *)((this->tran_stage).
                      super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                      _M_impl.super__Vector_impl_data._M_start + 3));
  std::__cxx11::string::assign
            ((char *)((this->tran_stage).
                      super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                      _M_impl.super__Vector_impl_data._M_start + 4));
  local_478 = this;
  std::__cxx11::string::assign
            ((char *)((this->tran_stage).
                      super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                      _M_impl.super__Vector_impl_data._M_start + 5));
  for (lVar13 = 0xc0; pHVar8 = local_478, lVar13 != 0x5d0; lVar13 = lVar13 + 0xd8) {
    puVar1 = (undefined8 *)
             ((long)&(((this->tran_stage).
                       super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>.
                       _M_impl.super__Vector_impl_data._M_start)->name_)._M_dataplus._M_p + lVar13);
    initialiseScatterData(0x14,(HighsScatterData *)(puVar1 + -0x14));
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)(puVar1 + 2) = 0;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&local_478->original_start_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&pHVar8->new_start_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&pHVar8->historical_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&pHVar8->predicted_density_tolerance,6);
  pdVar5 = (pHVar8->original_start_density_tolerance).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = (pHVar8->new_start_density_tolerance).super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
    pdVar5[lVar13] = 0.05;
    pdVar6[lVar13] = 0.05;
  }
  pdVar5 = (pHVar8->historical_density_tolerance).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *pdVar5 = 0.15;
  pdVar5[2] = 0.1;
  pdVar5[3] = 0.1;
  pdVar5[5] = 0.15;
  pdVar5 = (pHVar8->predicted_density_tolerance).super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *pdVar5 = 0.1;
  pdVar5[2] = 0.1;
  pdVar5[3] = 0.1;
  pdVar5[5] = 0.1;
  iVar3 = (options->super_HighsOptionsStruct).simplex_dual_edge_weight_strategy;
  if ((iVar3 == -1) || (iVar3 == 2)) {
    pHVar8->max_average_log_high_dual_steepest_edge_weight_error = 0.0;
    pHVar8->max_sum_average_log_extreme_dual_steepest_edge_weight_error = 0.0;
    pHVar8->max_sum_average_frequency_extreme_dual_steepest_edge_weight = 0.0;
    pHVar8->max_average_log_low_dual_steepest_edge_weight_error = 0.0;
    pHVar8->max_average_frequency_low_dual_steepest_edge_weight = 0.0;
    pHVar8->max_average_frequency_high_dual_steepest_edge_weight = 0.0;
    pHVar8->average_log_low_dual_steepest_edge_weight_error = 0.0;
    pHVar8->average_log_high_dual_steepest_edge_weight_error = 0.0;
    pHVar8->average_frequency_low_dual_steepest_edge_weight = 0.0;
    pHVar8->average_frequency_high_dual_steepest_edge_weight = 0.0;
    pHVar8->num_dual_steepest_edge_weight_check = 0;
    pHVar8->num_dual_steepest_edge_weight_reject = 0;
    pHVar8->num_wrong_low_dual_steepest_edge_weight = 0;
    pHVar8->num_wrong_high_dual_steepest_edge_weight = 0;
  }
  pHVar8->num_devex_framework = 0;
  pHVar8->num_invert_report_since_last_header = -1;
  pHVar8->num_iteration_report_since_last_header = -1;
  pHVar8->entering_variable = -1;
  pHVar8->pivotal_row_index = -1;
  pHVar8->average_concurrency = -1.0;
  pHVar8->average_fraction_of_possible_minor_iterations_performed = -1.0;
  pHVar8->sum_multi_chosen = 0;
  pHVar8->sum_multi_finished = 0;
  if (pHVar8->analyse_simplex_summary_data == true) {
    pHVar8->AnIterPrevIt = simplex_iteration_count_;
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[0].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[1].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[2].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[3].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[4].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[5].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[6].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[7].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[8].AnIterOpName);
    std::__cxx11::string::assign((char *)&pHVar8->AnIterOp[9].AnIterOpName);
    pAVar7 = pHVar8->AnIterOp;
    for (lVar13 = 0; pHVar9 = local_478, value_distribution = &pAVar7->AnIterOp_density,
        lVar13 != 10; lVar13 = lVar13 + 1) {
      bVar14 = ((uint)lVar13 & 0xb) == 1;
      uVar17 = (uint)(bVar14 || lVar13 == 3);
      uVar16 = (uint)((long)((ulong)uVar17 << 0x3f) >> 0x3f);
      uVar17 = (uint)((long)((ulong)uVar17 << 0x3f) >> 0x3f);
      *(uint *)((long)(value_distribution + -1) + 0x48) = ~uVar16 & 0x9999999a;
      *(uint *)((long)(value_distribution + -1) + 0x4c) = uVar16 & 0x3ff00000 | ~uVar16 & 0x3fa99999
      ;
      *(uint *)((long)(value_distribution + -1) + 0x50) = ~uVar17 & 0x33333333;
      *(uint *)((long)(value_distribution + -1) + 0x54) = uVar17 & 0x3ff00000 | ~uVar17 & 0x3fc33333
      ;
      pHVar10 = &pHVar8->numRow;
      if (bVar14 || lVar13 == 3) {
        pHVar10 = &pHVar8->numCol;
      }
      *(HighsInt *)((long)(value_distribution + -1) + 0x58) = *pHVar10;
      *(undefined1 (*) [16])((long)(value_distribution + -1) + 0x5c) = (undefined1  [16])0x0;
      *(undefined4 *)((long)(value_distribution + -1) + 0x6c) = 0;
      std::__cxx11::string::string((string *)&local_50,"",&local_479);
      std::__cxx11::string::string((string *)&local_70,"density ",&local_47a);
      initialiseValueDistribution(&local_50,&local_70,1e-08,1.0,10.0,value_distribution);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      pAVar7 = (AnIterOpRec *)(value_distribution + 1);
    }
    for (lVar13 = 0x76d; lVar13 != 0x778; lVar13 = lVar13 + 1) {
      *(undefined4 *)((long)&local_478->timer_ + lVar13 * 4) = 0;
    }
    local_478->num_col_price = 0;
    local_478->num_row_price = 0;
    local_478->num_row_price_with_switch = 0;
    local_478->num_primal_cycling_detections = 0;
    local_478->num_dual_cycling_detections = 0;
    local_478->num_quad_chuzc = 0;
    local_478->num_heap_chuzc = 0;
    local_478->sum_quad_chuzc_size = 0.0;
    local_478->sum_heap_chuzc_size = 0.0;
    local_478->max_quad_chuzc_size = 0;
    local_478->max_heap_chuzc_size = 0;
    local_478->num_improve_choose_column_row_call = 0;
    local_478->num_remove_pivot_from_pack = 0;
    local_478->num_correct_dual_primal_flip = 0;
    local_478->min_correct_dual_primal_flip_dual_infeasibility = INFINITY;
    local_478->max_correct_dual_primal_flip = 0.0;
    local_478->num_correct_dual_cost_shift = 0;
    local_478->max_correct_dual_cost_shift_dual_infeasibility = 0.0;
    local_478->max_correct_dual_cost_shift = 0.0;
    local_478->net_num_single_cost_shift = 0;
    local_478->num_single_cost_shift = 0;
    local_478->max_single_cost_shift = 0.0;
    local_478->sum_single_cost_shift = 0.0;
    for (lVar13 = 0x778; lVar13 != 0x77b; lVar13 = lVar13 + 1) {
      *(undefined4 *)((long)&local_478->timer_ + lVar13 * 4) = 0;
    }
    local_478->AnIterTraceNumRec = 0;
    local_478->AnIterTraceIterDl = 1;
    local_478->AnIterTrace[0].AnIterTraceIter = local_478->AnIterIt0;
    dVar15 = HighsTimer::getWallTime(local_478->timer_);
    pHVar9->AnIterTrace[0].AnIterTraceTime = dVar15;
    std::__cxx11::string::string((string *)&local_90,"Primal step summary",&local_479);
    std::__cxx11::string::string((string *)&local_b0,"",&local_47a);
    initialiseValueDistribution
              (&local_90,&local_b0,1e-16,1e+16,10.0,&pHVar9->primal_step_distribution);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_d0,"Dual step summary",&local_479);
    std::__cxx11::string::string((string *)&local_f0,"",&local_47a);
    initialiseValueDistribution
              (&local_d0,&local_f0,1e-16,1e+16,10.0,&pHVar9->dual_step_distribution);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_110,"Simplex pivot summary",&local_479);
    std::__cxx11::string::string((string *)&local_130,"",&local_47a);
    initialiseValueDistribution
              (&local_110,&local_130,1e-08,1e+16,10.0,&pHVar9->simplex_pivot_distribution);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_150,"Factor pivot threshold summary",&local_479);
    std::__cxx11::string::string((string *)&local_170,"",&local_47a);
    initialiseValueDistribution
              (&local_150,&local_170,0.0008,0.5,5.0,&pHVar9->factor_pivot_threshold_distribution);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string((string *)&local_190,"Numerical trouble summary",&local_479);
    std::__cxx11::string::string((string *)&local_1b0,"",&local_47a);
    initialiseValueDistribution
              (&local_190,&local_1b0,1e-16,1.0,10.0,&pHVar9->numerical_trouble_distribution);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string((string *)&local_1d0,"Edge weight error summary",&local_479);
    std::__cxx11::string::string((string *)&local_1f0,"",&local_47a);
    initialiseValueDistribution
              (&local_1d0,&local_1f0,1e-16,1.0,10.0,&pHVar9->edge_weight_error_distribution);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string((string *)&local_210,"",&local_479);
    std::__cxx11::string::string((string *)&local_230,"1 ",&local_47a);
    initialiseValueDistribution
              (&local_210,&local_230,1e-16,1e+16,10.0,&pHVar9->cost_perturbation1_distribution);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string((string *)&local_250,"",&local_479);
    std::__cxx11::string::string((string *)&local_270,"2 ",&local_47a);
    initialiseValueDistribution
              (&local_250,&local_270,1e-16,1e+16,10.0,&pHVar9->cost_perturbation2_distribution);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string
              ((string *)&local_290,"FTRAN upper sparse summary - before",&local_479);
    std::__cxx11::string::string((string *)&local_2b0,"",&local_47a);
    initialiseValueDistribution
              (&local_290,&local_2b0,1e-08,1.0,10.0,&pHVar9->before_ftran_upper_sparse_density);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_2d0,"FTRAN upper sparse summary - after",&local_479);
    std::__cxx11::string::string((string *)&local_2f0,"",&local_47a);
    initialiseValueDistribution
              (&local_2d0,&local_2f0,1e-08,1.0,10.0,&pHVar9->before_ftran_upper_hyper_density);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string
              ((string *)&local_310,"FTRAN upper hyper-sparse summary - before",&local_479);
    std::__cxx11::string::string((string *)&local_330,"",&local_47a);
    initialiseValueDistribution
              (&local_310,&local_330,1e-08,1.0,10.0,&pHVar9->ftran_upper_sparse_density);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string
              ((string *)&local_350,"FTRAN upper hyper-sparse summary - after",&local_479);
    std::__cxx11::string::string((string *)&local_370,"",&local_47a);
    initialiseValueDistribution
              (&local_350,&local_370,1e-08,1.0,10.0,&pHVar9->ftran_upper_hyper_density);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string((string *)&local_390,"Cleanup dual change summary",&local_479);
    std::__cxx11::string::string((string *)&local_3b0,"",&local_47a);
    initialiseValueDistribution
              (&local_390,&local_3b0,1e-16,1e+16,10.0,&pHVar9->cleanup_dual_change_distribution);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string((string *)&local_3d0,"Cleanup primal change summary",&local_479);
    std::__cxx11::string::string((string *)&local_3f0,"",&local_47a);
    initialiseValueDistribution
              (&local_3d0,&local_3f0,1e-16,1e+16,10.0,&pHVar9->cleanup_primal_step_distribution);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::string((string *)&local_410,"Cleanup primal step summary",&local_479);
    std::__cxx11::string::string((string *)&local_430,"",&local_47a);
    initialiseValueDistribution
              (&local_410,&local_430,1e-16,1e+16,10.0,&pHVar9->cleanup_primal_change_distribution);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::string((string *)&local_450,"Cleanup dual step summary",&local_479);
    std::__cxx11::string::string((string *)&local_470,"",&local_47a);
    initialiseValueDistribution
              (&local_450,&local_470,1e-16,1e+16,10.0,&pHVar9->cleanup_dual_step_distribution);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_450);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setup(const std::string lp_name, const HighsLp& lp,
                                 const HighsOptions& options,
                                 const HighsInt simplex_iteration_count_) {
  // Copy Problem size
  numRow = lp.num_row_;
  numCol = lp.num_col_;
  numTot = numRow + numCol;
  model_name_ = lp.model_name_;
  lp_name_ = lp_name;
  // Set up analysis logic short-cuts
  analyse_lp_data = kHighsAnalysisLevelModelData & options.highs_analysis_level;
  analyse_simplex_summary_data =
      kHighsAnalysisLevelSolverSummaryData & options.highs_analysis_level;
  analyse_simplex_runtime_data =
      kHighsAnalysisLevelSolverRuntimeData & options.highs_analysis_level;
  analyse_factor_data =
      kHighsAnalysisLevelNlaData & options.highs_analysis_level;
  analyse_simplex_data =
      analyse_simplex_summary_data || analyse_simplex_runtime_data;
  highs_run_time = 0;
  last_user_log_time = -kHighsInf;
  delta_user_log_time = 5e0;

  setupSimplexTime(options);
  setupFactorTime(options);

  // Copy tolerances from options
  //  allow_dual_steepest_edge_to_devex_switch =
  //      options.simplex_dual_edge_weight_strategy ==
  //      kSimplexEdgeWeightStrategyChoose;
  //  dual_steepest_edge_weight_log_error_threshold =
  //      options.dual_steepest_edge_weight_log_error_threshold;
  //
  AnIterIt0 = simplex_iteration_count_;
  //  AnIterCostlyDseFq = 0;
  //  AnIterNumCostlyDseIt = 0;
  // Copy messaging parameter from options
  messaging(options.log_options);
  timeless_log = options.timeless_log;
  // Initialise the densities
  col_aq_density = 0;
  row_ep_density = 0;
  row_ap_density = 0;
  row_DSE_density = 0;
  col_steepest_edge_density = 0;
  col_basic_feasibility_change_density = 0;
  row_basic_feasibility_change_density = 0;
  col_BFRT_density = 0;
  primal_col_density = 0;
  // Set the row_dual_density to 1 since it's assumed all costs are at
  // least perturbed from zero, if not initially nonzero
  dual_col_density = 1;
  // Set up the data structures for scatter data
  tran_stage.resize(NUM_TRAN_STAGE_TYPE);
  tran_stage[TRAN_STAGE_FTRAN_LOWER].name_ = "FTRAN lower";
  tran_stage[TRAN_STAGE_FTRAN_UPPER_FT].name_ = "FTRAN upper FT";
  tran_stage[TRAN_STAGE_FTRAN_UPPER].name_ = "FTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER].name_ = "BTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER_FT].name_ = "BTRAN upper FT";
  tran_stage[TRAN_STAGE_BTRAN_LOWER].name_ = "BTRAN lower";
  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    TranStageAnalysis& stage = tran_stage[tran_stage_type];
    initialiseScatterData(20, stage.rhs_density_);
    stage.num_decision_ = 0;
    stage.num_wrong_original_sparse_decision_ = 0;
    stage.num_wrong_original_hyper_decision_ = 0;
    stage.num_wrong_new_sparse_decision_ = 0;
    stage.num_wrong_new_hyper_decision_ = 0;
  }
  original_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  new_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  historical_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  predicted_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);

  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    original_start_density_tolerance[tran_stage_type] = 0.05;
    new_start_density_tolerance[tran_stage_type] = 0.05;
  }
  historical_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.15;
  historical_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.15;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.10;

  // Initialise the measures used to analyse accuracy of steepest edge weights
  //
  const HighsInt dual_edge_weight_strategy =
      options.simplex_dual_edge_weight_strategy;
  if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      dual_edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge) {
    // Initialise the measures used to analyse accuracy of steepest edge weights
    num_dual_steepest_edge_weight_check = 0;
    num_dual_steepest_edge_weight_reject = 0;
    num_wrong_low_dual_steepest_edge_weight = 0;
    num_wrong_high_dual_steepest_edge_weight = 0;
    average_frequency_low_dual_steepest_edge_weight = 0;
    average_frequency_high_dual_steepest_edge_weight = 0;
    average_log_low_dual_steepest_edge_weight_error = 0;
    average_log_high_dual_steepest_edge_weight_error = 0;
    max_average_frequency_low_dual_steepest_edge_weight = 0;
    max_average_frequency_high_dual_steepest_edge_weight = 0;
    max_sum_average_frequency_extreme_dual_steepest_edge_weight = 0;
    max_average_log_low_dual_steepest_edge_weight_error = 0;
    max_average_log_high_dual_steepest_edge_weight_error = 0;
    max_sum_average_log_extreme_dual_steepest_edge_weight_error = 0;
  }
  num_devex_framework = 0;

  num_iteration_report_since_last_header = -1;
  num_invert_report_since_last_header = -1;
  // Set values used to skip an iteration report when column (row)
  // choice has found nothing in primal (dual) simplex
  entering_variable = -1;
  pivotal_row_index = -1;

  // Set following averages to illegal values so that first average is
  // set equal to first value
  average_concurrency = -1;
  average_fraction_of_possible_minor_iterations_performed = -1;
  sum_multi_chosen = 0;
  sum_multi_finished = 0;

  if (analyse_simplex_summary_data) {
    AnIterPrevIt = simplex_iteration_count_;

    AnIterOpRec* AnIter;
    AnIter = &AnIterOp[kSimplexNlaBtranFull];
    AnIter->AnIterOpName = "BTRAN Full";
    AnIter = &AnIterOp[kSimplexNlaPriceFull];
    AnIter->AnIterOpName = "PRICE Full";
    AnIter = &AnIterOp[kSimplexNlaBtranBasicFeasibilityChange];
    AnIter->AnIterOpName = "BTRAN BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaPriceBasicFeasibilityChange];
    AnIter->AnIterOpName = "PRICE BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaBtranEp];
    AnIter->AnIterOpName = "BTRAN e_p";
    AnIter = &AnIterOp[kSimplexNlaPriceAp];
    AnIter->AnIterOpName = "PRICE a_p";
    AnIter = &AnIterOp[kSimplexNlaFtran];
    AnIter->AnIterOpName = "FTRAN";
    AnIter = &AnIterOp[kSimplexNlaFtranBfrt];
    AnIter->AnIterOpName = "FTRAN BFRT";
    AnIter = &AnIterOp[kSimplexNlaFtranDse];
    AnIter->AnIterOpName = "FTRAN DSE";
    AnIter = &AnIterOp[kSimplexNlaBtranPse];
    AnIter->AnIterOpName = "BTRAN PSE";
    for (HighsInt k = 0; k < kNumSimplexNlaOperation; k++) {
      AnIter = &AnIterOp[k];
      if ((k == kSimplexNlaPriceAp) ||
          (k == kSimplexNlaPriceBasicFeasibilityChange) ||
          (k == kSimplexNlaPriceFull)) {
        AnIter->AnIterOpHyperCANCEL = 1.0;
        AnIter->AnIterOpHyperTRAN = 1.0;
        AnIter->AnIterOpRsDim = numCol;
      } else {
        if ((k == kSimplexNlaBtranEp) ||
            (k == kSimplexNlaBtranBasicFeasibilityChange) ||
            (k == kSimplexNlaBtranFull)) {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperBtranU;
        } else {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperFtranL;
        }
        AnIter->AnIterOpRsDim = numRow;
      }
      AnIter->AnIterOpNumCa = 0;
      AnIter->AnIterOpNumHyperOp = 0;
      AnIter->AnIterOpNumHyperRs = 0;
      AnIter->AnIterOpSumLog10RsDensity = 0;
      initialiseValueDistribution("", "density ", 1e-8, 1.0, 10.0,
                                  AnIter->AnIterOp_density);
    }
    HighsInt last_rebuild_reason = kRebuildReasonCount - 1;
    for (HighsInt k = 1; k <= last_rebuild_reason; k++) AnIterNumInvert[k] = 0;
    num_col_price = 0;
    num_row_price = 0;
    num_row_price_with_switch = 0;
    num_primal_cycling_detections = 0;
    num_dual_cycling_detections = 0;
    // Initialise the dual simplex flip/shift records
    num_quad_chuzc = 0;
    num_heap_chuzc = 0;
    sum_quad_chuzc_size = 0;
    sum_heap_chuzc_size = 0;
    max_quad_chuzc_size = 0;
    max_heap_chuzc_size = 0;

    num_improve_choose_column_row_call = 0;
    num_remove_pivot_from_pack = 0;

    num_correct_dual_primal_flip = 0;
    min_correct_dual_primal_flip_dual_infeasibility = kHighsInf;
    max_correct_dual_primal_flip = 0;
    num_correct_dual_cost_shift = 0;
    max_correct_dual_cost_shift_dual_infeasibility = 0;
    max_correct_dual_cost_shift = 0;
    net_num_single_cost_shift = 0;
    num_single_cost_shift = 0;
    max_single_cost_shift = 0;
    sum_single_cost_shift = 0;
    HighsInt last_edge_weight_mode = (HighsInt)EdgeWeightMode::kSteepestEdge;
    for (HighsInt k = 0; k <= last_edge_weight_mode; k++)
      AnIterNumEdWtIt[k] = 0;
    AnIterTraceNumRec = 0;
    AnIterTraceIterDl = 1;
    AnIterTraceRec* lcAnIter = &AnIterTrace[0];
    lcAnIter->AnIterTraceIter = AnIterIt0;
    lcAnIter->AnIterTraceTime = timer_->getWallTime();
    initialiseValueDistribution("Primal step summary", "", 1e-16, 1e16, 10.0,
                                primal_step_distribution);
    initialiseValueDistribution("Dual step summary", "", 1e-16, 1e16, 10.0,
                                dual_step_distribution);
    initialiseValueDistribution("Simplex pivot summary", "", 1e-8, 1e16, 10.0,
                                simplex_pivot_distribution);
    initialiseValueDistribution("Factor pivot threshold summary", "",
                                kMinPivotThreshold, kMaxPivotThreshold,
                                kPivotThresholdChangeFactor,
                                factor_pivot_threshold_distribution);
    initialiseValueDistribution("Numerical trouble summary", "", 1e-16, 1.0,
                                10.0, numerical_trouble_distribution);
    initialiseValueDistribution("Edge weight error summary", "", 1e-16, 1.0,
                                10.0, edge_weight_error_distribution);
    initialiseValueDistribution("", "1 ", 1e-16, 1e16, 10.0,
                                cost_perturbation1_distribution);
    initialiseValueDistribution("", "2 ", 1e-16, 1e16, 10.0,
                                cost_perturbation2_distribution);
    initialiseValueDistribution("FTRAN upper sparse summary - before", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper sparse summary - after", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_hyper_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - before", "",
                                1e-8, 1.0, 10.0, ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - after", "",
                                1e-8, 1.0, 10.0, ftran_upper_hyper_density);
    initialiseValueDistribution("Cleanup dual change summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_change_distribution);
    initialiseValueDistribution("Cleanup primal change summary", "", 1e-16,
                                1e16, 10.0, cleanup_primal_step_distribution);
    initialiseValueDistribution("Cleanup primal step summary", "", 1e-16, 1e16,
                                10.0, cleanup_primal_change_distribution);
    initialiseValueDistribution("Cleanup dual step summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_step_distribution);
  }
}